

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout-test.c++
# Opt level: O3

void capnp::_::anon_unknown_0::checkStruct(StructReader reader)

{
  long lVar1;
  short sVar2;
  int iVar3;
  SegmentReader *pSVar4;
  char cVar5;
  long lVar6;
  int i;
  ElementCount index;
  ulong uVar7;
  ulong uVar8;
  SegmentReader *in_stack_00000008;
  Fault f;
  long *in_stack_00000018;
  byte *in_stack_00000020;
  uint in_stack_00000028;
  ushort in_stack_0000002c;
  uint in_stack_00000030;
  StructReader subStruct;
  Fault f_3;
  ListReader local_108;
  uint local_d0;
  ushort local_ca;
  PointerReader local_c8;
  ListReader local_a8;
  uint local_6c;
  StructReader local_68;
  
  if (in_stack_00000028 < 0x40) {
    if (kj::_::Debug::minSeverity < 3) {
      pSVar4 = (SegmentReader *)0x0;
LAB_001af4bc:
      local_a8.segment = (SegmentReader *)0x1011121314151617;
      local_108.segment = pSVar4;
      kj::_::Debug::log<char_const(&)[90],unsigned_long_long,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0xea,ERROR,
                 "\"failed: expected \" \"(0x1011121314151617ull) == (reader.getDataField<uint64_t>(0 * ELEMENTS))\", 0x1011121314151617ull, reader.getDataField<uint64_t>(0 * ELEMENTS)"
                 ,(char (*) [90])
                  "failed: expected (0x1011121314151617ull) == (reader.getDataField<uint64_t>(0 * ELEMENTS))"
                 ,(unsigned_long_long *)&local_a8,(unsigned_long *)&local_108);
      goto LAB_001af4f1;
    }
  }
  else {
    pSVar4 = (SegmentReader *)*in_stack_00000018;
    if ((pSVar4 != (SegmentReader *)0x1011121314151617) && (kj::_::Debug::minSeverity < 3))
    goto LAB_001af4bc;
LAB_001af4f1:
    if (in_stack_00000028 < 0x60) {
      if (2 < kj::_::Debug::minSeverity) goto LAB_001af8b4;
      iVar3 = 0;
LAB_001af534:
      local_a8.segment = (SegmentReader *)CONCAT44(local_a8.segment._4_4_,0x20212223);
      local_108.segment = (SegmentReader *)CONCAT44(local_108.segment._4_4_,iVar3);
      kj::_::Debug::log<char_const(&)[80],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0xeb,ERROR,
                 "\"failed: expected \" \"(0x20212223u) == (reader.getDataField<uint32_t>(2 * ELEMENTS))\", 0x20212223u, reader.getDataField<uint32_t>(2 * ELEMENTS)"
                 ,(char (*) [80])
                  "failed: expected (0x20212223u) == (reader.getDataField<uint32_t>(2 * ELEMENTS))",
                 (uint *)&local_a8,(uint *)&local_108);
    }
    else {
      iVar3 = (int)in_stack_00000018[1];
      if ((iVar3 != 0x20212223) && (kj::_::Debug::minSeverity < 3)) goto LAB_001af534;
    }
    if (in_stack_00000028 < 0x70) {
      if (2 < kj::_::Debug::minSeverity) goto LAB_001af8b4;
      sVar2 = 0;
LAB_001af5ac:
      local_a8.segment = (SegmentReader *)CONCAT44(local_a8.segment._4_4_,0x3031);
      local_108.segment = (SegmentReader *)CONCAT62(local_108.segment._2_6_,sVar2);
      kj::_::Debug::log<char_const(&)[76],unsigned_int,unsigned_short>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0xec,ERROR,
                 "\"failed: expected \" \"(0x3031u) == (reader.getDataField<uint16_t>(6 * ELEMENTS))\", 0x3031u, reader.getDataField<uint16_t>(6 * ELEMENTS)"
                 ,(char (*) [76])
                  "failed: expected (0x3031u) == (reader.getDataField<uint16_t>(6 * ELEMENTS))",
                 (uint *)&local_a8,(unsigned_short *)&local_108);
    }
    else {
      sVar2 = *(short *)((long)in_stack_00000018 + 0xc);
      if ((sVar2 != 0x3031) && (kj::_::Debug::minSeverity < 3)) goto LAB_001af5ac;
    }
    if (in_stack_00000028 < 0x78) {
      if (2 < kj::_::Debug::minSeverity) goto LAB_001af8b4;
      cVar5 = '\0';
LAB_001af62c:
      local_a8.segment = (SegmentReader *)CONCAT44(local_a8.segment._4_4_,0x40);
      local_108.segment = (SegmentReader *)CONCAT71(local_108.segment._1_7_,cVar5);
      kj::_::Debug::log<char_const(&)[74],unsigned_int,unsigned_char>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0xed,ERROR,
                 "\"failed: expected \" \"(0x40u) == (reader.getDataField<uint8_t>(14 * ELEMENTS))\", 0x40u, reader.getDataField<uint8_t>(14 * ELEMENTS)"
                 ,(char (*) [74])
                  "failed: expected (0x40u) == (reader.getDataField<uint8_t>(14 * ELEMENTS))",
                 (uint *)&local_a8,(uchar *)&local_108);
    }
    else {
      cVar5 = *(char *)((long)in_stack_00000018 + 0xe);
      if (cVar5 != '@' && kj::_::Debug::minSeverity < 3) goto LAB_001af62c;
    }
    if (in_stack_00000028 < 0x79) {
LAB_001af717:
      if (kj::_::Debug::minSeverity < 3) {
LAB_001af720:
        kj::_::Debug::log<char_const(&)[59]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                   ,0xf0,ERROR,"\"failed: expected \" \"reader.getDataField<bool>(122 * ELEMENTS)\""
                   ,(char (*) [59])"failed: expected reader.getDataField<bool>(122 * ELEMENTS)");
        goto LAB_001af74d;
      }
LAB_001af7f1:
      if (2 < kj::_::Debug::minSeverity) goto LAB_001af8b4;
LAB_001af801:
      kj::_::Debug::log<char_const(&)[59]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0xf3,ERROR,"\"failed: expected \" \"reader.getDataField<bool>(125 * ELEMENTS)\"",
                 (char (*) [59])"failed: expected reader.getDataField<bool>(125 * ELEMENTS)");
    }
    else {
      if ((kj::_::Debug::minSeverity < 3 & *(byte *)((long)in_stack_00000018 + 0xf)) == 1) {
        kj::_::Debug::log<char_const(&)[62]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                   ,0xee,ERROR,
                   "\"failed: expected \" \"!(reader.getDataField<bool>(120 * ELEMENTS))\"",
                   (char (*) [62])"failed: expected !(reader.getDataField<bool>(120 * ELEMENTS))");
      }
      if (in_stack_00000028 == 0x79) goto LAB_001af717;
      if ((kj::_::Debug::minSeverity < 3 & *(byte *)((long)in_stack_00000018 + 0xf) >> 1) == 1) {
        kj::_::Debug::log<char_const(&)[62]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                   ,0xef,ERROR,
                   "\"failed: expected \" \"!(reader.getDataField<bool>(121 * ELEMENTS))\"",
                   (char (*) [62])"failed: expected !(reader.getDataField<bool>(121 * ELEMENTS))");
      }
      if (in_stack_00000028 < 0x7b) goto LAB_001af717;
      if (((*(byte *)((long)in_stack_00000018 + 0xf) & 4) == 0) && (kj::_::Debug::minSeverity < 3))
      goto LAB_001af720;
LAB_001af74d:
      if (in_stack_00000028 < 0x7c) {
LAB_001af79a:
        if (2 < kj::_::Debug::minSeverity) goto LAB_001af7f1;
LAB_001af7b0:
        kj::_::Debug::log<char_const(&)[59]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                   ,0xf2,ERROR,"\"failed: expected \" \"reader.getDataField<bool>(124 * ELEMENTS)\""
                   ,(char (*) [59])"failed: expected reader.getDataField<bool>(124 * ELEMENTS)");
      }
      else {
        if (((*(byte *)((long)in_stack_00000018 + 0xf) & 8) != 0) && (kj::_::Debug::minSeverity < 3)
           ) {
          kj::_::Debug::log<char_const(&)[62]>
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                     ,0xf1,ERROR,
                     "\"failed: expected \" \"!(reader.getDataField<bool>(123 * ELEMENTS))\"",
                     (char (*) [62])"failed: expected !(reader.getDataField<bool>(123 * ELEMENTS))")
          ;
        }
        if (in_stack_00000028 == 0x7c) goto LAB_001af79a;
        if (((*(byte *)((long)in_stack_00000018 + 0xf) & 0x10) == 0) &&
           (kj::_::Debug::minSeverity < 3)) goto LAB_001af7b0;
      }
      if (in_stack_00000028 < 0x7e) goto LAB_001af7f1;
      if (((*(byte *)((long)in_stack_00000018 + 0xf) & 0x20) == 0) &&
         (kj::_::Debug::minSeverity < 3)) goto LAB_001af801;
    }
    if (in_stack_00000028 < 0x7f) {
      if (kj::_::Debug::minSeverity < 3) goto LAB_001af84e;
    }
    else {
      if (((*(byte *)((long)in_stack_00000018 + 0xf) & 0x40) == 0) &&
         (kj::_::Debug::minSeverity < 3)) {
LAB_001af84e:
        kj::_::Debug::log<char_const(&)[59]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                   ,0xf4,ERROR,"\"failed: expected \" \"reader.getDataField<bool>(126 * ELEMENTS)\""
                   ,(char (*) [59])"failed: expected reader.getDataField<bool>(126 * ELEMENTS)");
      }
      if (((0x7f < in_stack_00000028) && (*(char *)((long)in_stack_00000018 + 0xf) < '\0')) &&
         (kj::_::Debug::minSeverity < 3)) {
        kj::_::Debug::log<char_const(&)[62]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                   ,0xf5,ERROR,
                   "\"failed: expected \" \"!(reader.getDataField<bool>(127 * ELEMENTS))\"",
                   (char (*) [62])"failed: expected !(reader.getDataField<bool>(127 * ELEMENTS))");
      }
    }
  }
LAB_001af8b4:
  if (in_stack_0000002c == 0) {
    local_108.segment = (SegmentReader *)0x0;
    local_108.capTable = (CapTableReader *)0x0;
    local_108.ptr = (byte *)0x0;
    local_108.elementCount = 0x7fffffff;
  }
  else {
    local_108.segment = in_stack_00000008;
    local_108.capTable = (CapTableReader *)f.exception;
    local_108.ptr = in_stack_00000020;
    local_108.elementCount = in_stack_00000030;
  }
  PointerReader::getStruct
            ((StructReader *)&local_a8,(PointerReader *)&local_108,
             (word *)(anonymous_namespace)::SUBSTRUCT_DEFAULT);
  if (local_a8.structDataSize < 0x20) {
    if (2 < kj::_::Debug::minSeverity) goto LAB_001af980;
    iVar3 = 0;
  }
  else {
    if ((*(int *)local_a8.ptr == 0x7b) || (2 < kj::_::Debug::minSeverity)) goto LAB_001af980;
    iVar3 = *(int *)local_a8.ptr;
  }
  local_108.segment = (SegmentReader *)CONCAT44(local_108.segment._4_4_,0x7b);
  local_68.segment = (SegmentReader *)CONCAT44(local_68.segment._4_4_,iVar3);
  kj::_::Debug::log<char_const(&)[76],unsigned_int,unsigned_int>
            ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
             ,0xfa,ERROR,
             "\"failed: expected \" \"(123u) == (subStruct.getDataField<uint32_t>(0 * ELEMENTS))\", 123u, subStruct.getDataField<uint32_t>(0 * ELEMENTS)"
             ,(char (*) [76])
              "failed: expected (123u) == (subStruct.getDataField<uint32_t>(0 * ELEMENTS))",
             (uint *)&local_108,(uint *)&local_68);
LAB_001af980:
  if (in_stack_0000002c < 2) {
    local_108.segment = (SegmentReader *)0x0;
    local_108.capTable = (CapTableReader *)0x0;
    local_108.ptr = (byte *)0x0;
    local_108.elementCount = 0x7fffffff;
  }
  else {
    local_108.ptr = in_stack_00000020 + 8;
    local_108.segment = in_stack_00000008;
    local_108.capTable = (CapTableReader *)f.exception;
    local_108.elementCount = in_stack_00000030;
  }
  PointerReader::getList(&local_a8,(PointerReader *)&local_108,FOUR_BYTES,(word *)0x0);
  if (local_a8.elementCount != 3) {
    local_68.segment = (SegmentReader *)CONCAT44(local_68.segment._4_4_,3);
    local_c8.segment = (SegmentReader *)CONCAT44(local_c8.segment._4_4_,local_a8.elementCount);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              ((Fault *)&local_108,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0xff,FAILED,"(3 * ELEMENTS) == (list.size())","3 * ELEMENTS, list.size()",
               (uint *)&local_68,(uint *)&local_c8);
    kj::_::Debug::Fault::fatal((Fault *)&local_108);
  }
  if (kj::_::Debug::minSeverity < 3 && *(int *)local_a8.ptr != 200) {
    local_108.segment = (SegmentReader *)CONCAT44(local_108.segment._4_4_,200);
    local_68.segment = (SegmentReader *)CONCAT44(local_68.segment._4_4_,*(int *)local_a8.ptr);
    kj::_::Debug::log<char_const(&)[71],int,int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0x100,ERROR,
               "\"failed: expected \" \"(200) == (list.getDataElement<int32_t>(0 * ELEMENTS))\", 200, list.getDataElement<int32_t>(0 * ELEMENTS)"
               ,(char (*) [71])
                "failed: expected (200) == (list.getDataElement<int32_t>(0 * ELEMENTS))",
               (int *)&local_108,(int *)&local_68);
  }
  if (kj::_::Debug::minSeverity < 3 &&
      *(int *)((long)local_a8.ptr + (ulong)(local_a8.step >> 3)) != 0xc9) {
    local_108.segment = (SegmentReader *)CONCAT44(local_108.segment._4_4_,0xc9);
    local_68.segment =
         (SegmentReader *)
         CONCAT44(local_68.segment._4_4_,
                  *(undefined4 *)((long)local_a8.ptr + (ulong)(local_a8.step >> 3)));
    kj::_::Debug::log<char_const(&)[71],int,int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0x101,ERROR,
               "\"failed: expected \" \"(201) == (list.getDataElement<int32_t>(1 * ELEMENTS))\", 201, list.getDataElement<int32_t>(1 * ELEMENTS)"
               ,(char (*) [71])
                "failed: expected (201) == (list.getDataElement<int32_t>(1 * ELEMENTS))",
               (int *)&local_108,(int *)&local_68);
  }
  if ((*(int *)((long)local_a8.ptr + (ulong)(local_a8.step >> 2)) != 0xca) &&
     (kj::_::Debug::minSeverity < 3)) {
    local_108.segment = (SegmentReader *)CONCAT44(local_108.segment._4_4_,0xca);
    local_68.segment =
         (SegmentReader *)
         CONCAT44(local_68.segment._4_4_,
                  *(undefined4 *)((long)local_a8.ptr + (ulong)(local_a8.step >> 2)));
    kj::_::Debug::log<char_const(&)[71],int,int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0x102,ERROR,
               "\"failed: expected \" \"(202) == (list.getDataElement<int32_t>(2 * ELEMENTS))\", 202, list.getDataElement<int32_t>(2 * ELEMENTS)"
               ,(char (*) [71])
                "failed: expected (202) == (list.getDataElement<int32_t>(2 * ELEMENTS))",
               (int *)&local_108,(int *)&local_68);
  }
  if (in_stack_0000002c < 3) {
    local_108.segment = (SegmentReader *)0x0;
    local_108.capTable = (CapTableReader *)0x0;
    local_108.ptr = (byte *)0x0;
    local_108.elementCount = 0x7fffffff;
  }
  else {
    local_108.ptr = in_stack_00000020 + 0x10;
    local_108.segment = in_stack_00000008;
    local_108.capTable = (CapTableReader *)f.exception;
    local_108.elementCount = in_stack_00000030;
  }
  index = 0;
  PointerReader::getList(&local_a8,(PointerReader *)&local_108,INLINE_COMPOSITE,(word *)0x0);
  if (local_a8.elementCount != 4) {
    local_68.segment = (SegmentReader *)CONCAT44(local_68.segment._4_4_,4);
    local_c8.segment = (SegmentReader *)CONCAT44(local_c8.segment._4_4_,local_a8.elementCount);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              ((Fault *)&local_108,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0x108,FAILED,"(4 * ELEMENTS) == (list.size())","4 * ELEMENTS, list.size()",
               (uint *)&local_68,(uint *)&local_c8);
    kj::_::Debug::Fault::fatal((Fault *)&local_108);
  }
  local_ca = in_stack_0000002c;
  do {
    ListReader::getStructElement((StructReader *)&local_108,&local_a8,index);
    if (local_108.structDataSize < 0x20) {
      if (kj::_::Debug::minSeverity < 3) {
        iVar3 = 0;
LAB_001afbf3:
        local_68.segment = (SegmentReader *)CONCAT44(local_68.segment._4_4_,index + 300);
        local_c8.segment = (SegmentReader *)CONCAT44(local_c8.segment._4_4_,iVar3);
        kj::_::Debug::log<char_const(&)[76],int,int>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                   ,0x10b,ERROR,
                   "\"failed: expected \" \"(300 + i) == (element.getDataField<int32_t>(0 * ELEMENTS))\", 300 + i, element.getDataField<int32_t>(0 * ELEMENTS)"
                   ,(char (*) [76])
                    "failed: expected (300 + i) == (element.getDataField<int32_t>(0 * ELEMENTS))",
                   (int *)&local_68,(int *)&local_c8);
      }
    }
    else if ((index + 300 != *(int *)local_108.ptr) && (kj::_::Debug::minSeverity < 3)) {
      iVar3 = *(int *)local_108.ptr;
      goto LAB_001afbf3;
    }
    if (local_108.structPointerCount == 0) {
      local_c8.segment = (SegmentReader *)0x0;
      local_c8.capTable = (CapTableReader *)0x0;
      local_c8.pointer = (WirePointer *)0x0;
      local_c8.nestingLimit = 0x7fffffff;
    }
    else {
      local_c8.pointer = (WirePointer *)CONCAT44(local_108.step,local_108.elementCount);
      local_c8.segment = local_108.segment;
      local_c8.capTable = local_108.capTable;
      local_c8.nestingLimit = local_108.nestingLimit;
    }
    PointerReader::getStruct
              (&local_68,&local_c8,
               (word *)(anonymous_namespace)::STRUCTLIST_ELEMENT_SUBSTRUCT_DEFAULT);
    if (((local_68.dataSize < 0x20) || (index + 400 != *local_68.data)) &&
       (kj::_::Debug::minSeverity < 3)) {
      if (local_108.structPointerCount == 0) {
        local_c8.segment = (SegmentReader *)0x0;
        local_c8.capTable = (CapTableReader *)0x0;
        local_c8.pointer = (WirePointer *)0x0;
        local_c8.nestingLimit = 0x7fffffff;
      }
      else {
        local_c8.pointer = (WirePointer *)CONCAT44(local_108.step,local_108.elementCount);
        local_c8.segment = local_108.segment;
        local_c8.capTable = local_108.capTable;
        local_c8.nestingLimit = local_108.nestingLimit;
      }
      local_d0 = index + 400;
      PointerReader::getStruct
                (&local_68,&local_c8,
                 (word *)(anonymous_namespace)::STRUCTLIST_ELEMENT_SUBSTRUCT_DEFAULT);
      local_6c = 0;
      if (0x1f < local_68.dataSize) {
        local_6c = *local_68.data;
      }
      kj::_::Debug::log<char_const(&)[162],int,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x10f,ERROR,
                 "\"failed: expected \" \"(400 + i) == (element.getPointerField(0 * POINTERS) .getStruct(STRUCTLIST_ELEMENT_SUBSTRUCT_DEFAULT.words) .getDataField<int32_t>(0 * ELEMENTS))\", 400 + i, element.getPointerField(0 * POINTERS) .getStruct(STRUCTLIST_ELEMENT_SUBSTRUCT_DEFAULT.words) .getDataField<int32_t>(0 * ELEMENTS)"
                 ,(char (*) [162])
                  "failed: expected (400 + i) == (element.getPointerField(0 * POINTERS) .getStruct(STRUCTLIST_ELEMENT_SUBSTRUCT_DEFAULT.words) .getDataField<int32_t>(0 * ELEMENTS))"
                 ,(int *)&local_d0,(int *)&local_6c);
    }
    index = index + 1;
    if (index == 4) {
      if (local_ca < 4) {
        local_108.segment = (SegmentReader *)0x0;
        local_108.capTable = (CapTableReader *)0x0;
        local_108.ptr = (byte *)0x0;
        in_stack_00000030 = 0x7fffffff;
      }
      else {
        local_108.ptr = in_stack_00000020 + 0x18;
        local_108.segment = in_stack_00000008;
        local_108.capTable = (CapTableReader *)f.exception;
      }
      local_108.elementCount = in_stack_00000030;
      PointerReader::getList(&local_a8,(PointerReader *)&local_108,POINTER,(word *)0x0);
      if (local_a8.elementCount != 5) {
        local_68.segment = (SegmentReader *)CONCAT44(local_68.segment._4_4_,5);
        local_c8.segment = (SegmentReader *)CONCAT44(local_c8.segment._4_4_,local_a8.elementCount);
        kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
                  ((Fault *)&local_108,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                   ,0x115,FAILED,"(5 * ELEMENTS) == (list.size())","5 * ELEMENTS, list.size()",
                   (uint *)&local_68,(uint *)&local_c8);
        kj::_::Debug::Fault::fatal((Fault *)&local_108);
      }
      lVar6 = -1;
      uVar8 = 0;
      do {
        local_68.data = (void *)((local_a8.step * uVar8 >> 3) + (long)local_a8.ptr);
        local_68.segment = local_a8.segment;
        local_68.capTable = local_a8.capTable;
        local_68.pointers._0_4_ = local_a8.nestingLimit;
        PointerReader::getList(&local_108,(PointerReader *)&local_68,TWO_BYTES,(word *)0x0);
        uVar8 = uVar8 + 1;
        if (uVar8 != local_108.elementCount) {
          local_c8.segment = (SegmentReader *)CONCAT44(local_c8.segment._4_4_,(int)uVar8);
          local_d0 = local_108.elementCount;
          kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
                    ((Fault *)&local_68,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                     ,0x119,FAILED,"((i + 1) * ELEMENTS) == (element.size())",
                     "(i + 1) * ELEMENTS, element.size()",(uint *)&local_c8,&local_d0);
          kj::_::Debug::Fault::fatal((Fault *)&local_68);
        }
        uVar7 = 500;
        iVar3 = kj::_::Debug::minSeverity;
        do {
          if ((uVar7 != *(ushort *)(local_108.ptr + ((ulong)local_108.step * (uVar7 - 500) >> 3)))
             && (iVar3 < 3)) {
            local_68.segment = (SegmentReader *)CONCAT44(local_68.segment._4_4_,(int)uVar7);
            local_c8.segment =
                 (SegmentReader *)
                 CONCAT62(local_c8.segment._2_6_,
                          *(ushort *)(local_108.ptr + ((ulong)local_108.step * (uVar7 - 500) >> 3)))
            ;
            kj::_::Debug::log<char_const(&)[80],unsigned_int,unsigned_short>
                      ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                       ,0x11b,ERROR,
                       "\"failed: expected \" \"(500u + j) == (element.getDataElement<uint16_t>(j * ELEMENTS))\", 500u + j, element.getDataElement<uint16_t>(j * ELEMENTS)"
                       ,(char (*) [80])
                        "failed: expected (500u + j) == (element.getDataElement<uint16_t>(j * ELEMENTS))"
                       ,(uint *)&local_68,(unsigned_short *)&local_c8);
            iVar3 = kj::_::Debug::minSeverity;
          }
          lVar1 = lVar6 + uVar7;
          uVar7 = uVar7 + 1;
        } while (lVar1 != 499);
        lVar6 = lVar6 + -1;
      } while (uVar8 != 5);
      return;
    }
  } while( true );
}

Assistant:

static void checkStruct(StructReader reader) {
  EXPECT_EQ(0x1011121314151617ull, reader.getDataField<uint64_t>(0 * ELEMENTS));
  EXPECT_EQ(0x20212223u, reader.getDataField<uint32_t>(2 * ELEMENTS));
  EXPECT_EQ(0x3031u, reader.getDataField<uint16_t>(6 * ELEMENTS));
  EXPECT_EQ(0x40u, reader.getDataField<uint8_t>(14 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(120 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(121 * ELEMENTS));
  EXPECT_TRUE (reader.getDataField<bool>(122 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(123 * ELEMENTS));
  EXPECT_TRUE (reader.getDataField<bool>(124 * ELEMENTS));
  EXPECT_TRUE (reader.getDataField<bool>(125 * ELEMENTS));
  EXPECT_TRUE (reader.getDataField<bool>(126 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(127 * ELEMENTS));

  {
    StructReader subStruct = reader.getPointerField(0 * POINTERS)
                                   .getStruct(SUBSTRUCT_DEFAULT.words);
    EXPECT_EQ(123u, subStruct.getDataField<uint32_t>(0 * ELEMENTS));
  }

  {
    ListReader list = reader.getPointerField(1 * POINTERS).getList(ElementSize::FOUR_BYTES, nullptr);
    ASSERT_EQ(3 * ELEMENTS, list.size());
    EXPECT_EQ(200, list.getDataElement<int32_t>(0 * ELEMENTS));
    EXPECT_EQ(201, list.getDataElement<int32_t>(1 * ELEMENTS));
    EXPECT_EQ(202, list.getDataElement<int32_t>(2 * ELEMENTS));
  }

  {
    ListReader list = reader.getPointerField(2 * POINTERS)
                            .getList(ElementSize::INLINE_COMPOSITE, nullptr);
    ASSERT_EQ(4 * ELEMENTS, list.size());
    for (int i = 0; i < 4; i++) {
      StructReader element = list.getStructElement(i * ELEMENTS);
      EXPECT_EQ(300 + i, element.getDataField<int32_t>(0 * ELEMENTS));
      EXPECT_EQ(400 + i,
          element.getPointerField(0 * POINTERS)
                 .getStruct(STRUCTLIST_ELEMENT_SUBSTRUCT_DEFAULT.words)
                 .getDataField<int32_t>(0 * ELEMENTS));
    }
  }

  {
    ListReader list = reader.getPointerField(3 * POINTERS).getList(ElementSize::POINTER, nullptr);
    ASSERT_EQ(5 * ELEMENTS, list.size());
    for (uint i = 0; i < 5; i++) {
      ListReader element = list.getPointerElement(i * ELEMENTS)
                               .getList(ElementSize::TWO_BYTES, nullptr);
      ASSERT_EQ((i + 1) * ELEMENTS, element.size());
      for (uint j = 0; j <= i; j++) {
        EXPECT_EQ(500u + j, element.getDataElement<uint16_t>(j * ELEMENTS));
      }
    }
  }
}